

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

bool __thiscall
Js::SourceDynamicProfileManager::ShouldSaveToProfileCache
          (SourceDynamicProfileManager *this,SourceContextInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type pcVar6;
  char16_t *form;
  BVFixed *bv;
  BVFixed *pBVar7;
  
  if (this->isNonCachableScript == true) {
    if (DAT_015bc46a != '\x01') {
      return false;
    }
    pcVar6 = (info->field_5).field_0.url;
    form = L"Skipping save of profile. Non-cacheable resource. %s\n";
  }
  else {
    if (((this->dataCacheWrapper).ptr)->blocksWritten != 0) {
      bVar2 = true;
      if (DAT_015bc46a != '\x01') {
        return true;
      }
      pcVar6 = (info->field_5).field_0.url;
      form = L"Saving profile. There are other blocks in the cache. %s\n";
      goto LAB_00aff8ef;
    }
    pBVar7 = (this->startupFunctions).ptr;
    if ((pBVar7 != (BVFixed *)0x0) && (BVar3 = BVFixed::Length(pBVar7), 5 < BVar3)) {
      pBVar7 = (this->cachedStartupFunctions).ptr;
      if (pBVar7 == (BVFixed *)0x0) {
        return true;
      }
      bv = (this->startupFunctions).ptr;
      if (pBVar7 == bv) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                    ,0xf4,"(cachedStartupFunctions != startupFunctions)",
                                    "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        bv = (this->startupFunctions).ptr;
        pBVar7 = (this->cachedStartupFunctions).ptr;
      }
      uVar4 = BVFixed::DiffCount(pBVar7,bv);
      BVar3 = BVFixed::Length((this->cachedStartupFunctions).ptr);
      if (uVar4 <= (BVar3 * 0xf) / 100) {
        if (DAT_015bc46a == '\0') {
          return false;
        }
        Output::Trace(DynamicProfilePhase,
                      L"Skipping save of profile. Number of functions different: %d %s\n",
                      (ulong)uVar4,(info->field_5).field_0.url);
        return false;
      }
      if (DAT_015bc46a != '\0') {
        Output::Trace(DynamicProfilePhase,L"Number of functions different: %d \n",(ulong)uVar4);
        return true;
      }
      return true;
    }
    if (DAT_015bc46a != '\x01') {
      return false;
    }
    pcVar6 = (info->field_5).field_0.url;
    form = L"Skipping save of profile. Small number of functions. %s\n";
  }
  bVar2 = false;
LAB_00aff8ef:
  Output::Trace(DynamicProfilePhase,form,pcVar6);
  return bVar2;
}

Assistant:

bool SourceDynamicProfileManager::ShouldSaveToProfileCache(SourceContextInfo* info) const
    {
        if(isNonCachableScript)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Non-cacheable resource. %s\n"), info->url);
            return false;
        }

        if (dataCacheWrapper->BlocksWritten() > 0)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Saving profile. There are other blocks in the cache. %s\n"), info->url);
            return true;
        }

        if(!startupFunctions || startupFunctions->Length() <= DEFAULT_CONFIG_MinProfileCacheSize)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Small number of functions. %s\n"), info->url);
            return false;
        }

        if(cachedStartupFunctions)
        {
            AssertMsg(cachedStartupFunctions != startupFunctions, "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources");
            uint numberOfBitsDifferent = cachedStartupFunctions->DiffCount(startupFunctions);
            uint saveThreshold = (cachedStartupFunctions->Length() * DEFAULT_CONFIG_ProfileDifferencePercent) / 100;
            if(numberOfBitsDifferent <= saveThreshold)
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Number of functions different: %d %s\n"), numberOfBitsDifferent, info->url);
                return false;
            }
            else
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Number of functions different: %d \n"), numberOfBitsDifferent);
            }
        }
        return true;
    }